

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRUtil.cpp
# Opt level: O2

int printHelp(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage SoapySDRUtil [options]");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  Options summary:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    --help \t\t\t\t Print this help message");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"    --info \t\t\t\t Print module information");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --find[=\"driver=foo,type=bar\"] \t Discover available devices");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --make[=\"driver=foo,type=bar\"] \t Create a device instance");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --probe[=\"driver=foo,type=bar\"] \t Print detailed information");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"  Advanced options:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --check[=driverName] \t\t Check if driver is present");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --sparse             \t\t Simplified output for --find");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"  Rate testing options:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --args[=\"driver=foo\"] \t\t Arguments for testing");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --rate[=stream rate Sps] \t\t Rate in samples per second");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --channels[=\"0, 1, 2\"] \t\t List of channels, default 0");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "    --direction[=RX or TX] \t\t Specify the channel direction");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return (int)poVar1;
}

Assistant:

static int printHelp(void)
{
    std::cout << "Usage SoapySDRUtil [options]" << std::endl;
    std::cout << "  Options summary:" << std::endl;
    std::cout << "    --help \t\t\t\t Print this help message" << std::endl;
    std::cout << "    --info \t\t\t\t Print module information" << std::endl;
    std::cout << "    --find[=\"driver=foo,type=bar\"] \t Discover available devices" << std::endl;
    std::cout << "    --make[=\"driver=foo,type=bar\"] \t Create a device instance" << std::endl;
    std::cout << "    --probe[=\"driver=foo,type=bar\"] \t Print detailed information" << std::endl;
    std::cout << std::endl;

    std::cout << "  Advanced options:" << std::endl;
    std::cout << "    --check[=driverName] \t\t Check if driver is present" << std::endl;
    std::cout << "    --sparse             \t\t Simplified output for --find" << std::endl;
    std::cout << std::endl;

    std::cout << "  Rate testing options:" << std::endl;
    std::cout << "    --args[=\"driver=foo\"] \t\t Arguments for testing" << std::endl;
    std::cout << "    --rate[=stream rate Sps] \t\t Rate in samples per second" << std::endl;
    std::cout << "    --channels[=\"0, 1, 2\"] \t\t List of channels, default 0" << std::endl;
    std::cout << "    --direction[=RX or TX] \t\t Specify the channel direction" << std::endl;
    std::cout << std::endl;
    return EXIT_SUCCESS;
}